

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdblobimpl.h
# Opt level: O0

bool __thiscall SQBlob::Resize(SQBlob *this,SQInteger n)

{
  void *__s;
  size_t in_RSI;
  SQUnsignedInteger in_RDI;
  uchar *newbuf;
  undefined1 local_1;
  
  if ((*(byte *)(in_RDI + 0x28) & 1) == 0) {
    local_1 = false;
  }
  else {
    if (in_RSI != *(size_t *)(in_RDI + 0x10)) {
      __s = sq_malloc(0x14c374);
      memset(__s,0,in_RSI);
      if ((long)in_RSI < *(long *)(in_RDI + 8)) {
        memcpy(__s,*(void **)(in_RDI + 0x20),in_RSI);
      }
      else {
        memcpy(__s,*(void **)(in_RDI + 0x20),*(size_t *)(in_RDI + 8));
      }
      sq_free(__s,in_RDI);
      *(void **)(in_RDI + 0x20) = __s;
      *(size_t *)(in_RDI + 0x10) = in_RSI;
      if (*(long *)(in_RDI + 0x10) < *(long *)(in_RDI + 8)) {
        *(undefined8 *)(in_RDI + 8) = *(undefined8 *)(in_RDI + 0x10);
      }
      if (*(long *)(in_RDI + 0x10) < *(long *)(in_RDI + 0x18)) {
        *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)(in_RDI + 0x10);
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Resize(SQInteger n) {
        if(!_owns) return false;
        if(n != _allocated) {
            unsigned char *newbuf = (unsigned char *)sq_malloc(n);
            memset(newbuf,0,n);
            if(_size > n)
                memcpy(newbuf,_buf,n);
            else
                memcpy(newbuf,_buf,_size);
            sq_free(_buf,_allocated);
            _buf=newbuf;
            _allocated = n;
            if(_size > _allocated)
                _size = _allocated;
            if(_ptr > _allocated)
                _ptr = _allocated;
        }
        return true;
    }